

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

interval_t __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,duckdb::interval_t,duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>
          *accessor)

{
  DataChunk *pDVar1;
  idx_t iVar2;
  CURSOR *pCVar3;
  long lVar4;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>,_duckdb::QuantileIndirect<duckdb::timestamp_t>_>_>_>
  __comp_01;
  bool bVar5;
  ulong uVar6;
  reference pvVar7;
  idx_t iVar8;
  ulong uVar9;
  InvalidInputException *pIVar10;
  int64_t iVar11;
  idx_t iVar12;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *pMVar13;
  idx_t iVar14;
  RESULT_TYPE RVar15;
  interval_t iVar16;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  interval_t result_1;
  string local_88;
  pointer local_68;
  size_type sStack_60;
  MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t> *local_50;
  pointer local_48;
  size_type sStack_40;
  
  bVar5 = this->desc;
  iVar12 = this->CRN;
  iVar14 = this->FRN;
  iVar2 = this->begin;
  iVar8 = this->end;
  local_88._M_dataplus._M_p = (pointer)accessor;
  local_88._M_string_length = (size_type)accessor;
  local_88.field_2._M_local_buf[0] = bVar5;
  if (iVar12 == iVar14) {
    if (iVar12 != iVar8 && iVar2 != iVar8) {
      uVar6 = (long)(iVar8 * 8 + iVar2 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar5;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar2,v_t + iVar12,v_t + iVar8,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp);
      iVar12 = this->FRN;
    }
    pMVar13 = accessor->outer;
    pCVar3 = accessor->inner->data;
    uVar6 = v_t[iVar12];
    if (((pCVar3->scan).next_row_index <= uVar6) ||
       (uVar9 = (pCVar3->scan).current_row_index, uVar6 < uVar9)) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,uVar6,&pCVar3->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (timestamp_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar3->validity = &pvVar7->validity;
      uVar9 = (pCVar3->scan).current_row_index;
    }
    local_88._M_dataplus._M_p = (pointer)pCVar3->data[(uint)((int)uVar6 - (int)uVar9)].value;
    RVar15 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar13,(INPUT_TYPE *)&local_88);
    input._0_8_ = RVar15.micros;
    iVar11 = 0;
    bVar5 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar15,(interval_t *)&local_68,false);
    if (!bVar5) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar15._0_8_,input);
      InvalidInputException::InvalidInputException(pIVar10,&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar16.micros = sStack_60;
    iVar16._0_8_ = local_68;
  }
  else {
    if (iVar14 != iVar8 && iVar2 != iVar8) {
      uVar6 = (long)(iVar8 * 8 + iVar2 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar5;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar2,v_t + iVar14,v_t + iVar8,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar14 = this->FRN;
      iVar12 = this->CRN;
      iVar8 = this->end;
    }
    local_88._M_dataplus._M_p = (pointer)accessor;
    local_88._M_string_length = (size_type)accessor;
    local_88.field_2._M_local_buf[0] = bVar5;
    if (iVar12 != iVar8 && iVar14 != iVar8) {
      uVar6 = (long)(iVar8 * 8 + iVar14 * -8) >> 3;
      lVar4 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_88.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar5;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      ::std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::timestamp_t,duckdb::interval_t,duckdb::timestamp_t>,duckdb::QuantileIndirect<duckdb::timestamp_t>>>>>
                (v_t + iVar14,v_t + iVar12,v_t + iVar8,(ulong)(((uint)lVar4 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar14 = this->FRN;
    }
    pCVar3 = accessor->inner->data;
    uVar6 = v_t[iVar14];
    if (((pCVar3->scan).next_row_index <= uVar6) ||
       (uVar9 = (pCVar3->scan).current_row_index, pMVar13 = accessor->outer, uVar6 < uVar9)) {
      pDVar1 = &pCVar3->page;
      local_50 = accessor->outer;
      ColumnDataCollection::Seek(pCVar3->inputs,uVar6,&pCVar3->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (timestamp_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar3->validity = &pvVar7->validity;
      uVar9 = (pCVar3->scan).current_row_index;
      pMVar13 = local_50;
    }
    local_88._M_dataplus._M_p = (pointer)pCVar3->data[(uint)((int)uVar6 - (int)uVar9)].value;
    RVar15 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar13,(INPUT_TYPE *)&local_88);
    input_00._0_8_ = RVar15.micros;
    iVar11 = 0;
    bVar5 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar15,(interval_t *)&local_68,false);
    if (!bVar5) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar15._0_8_,input_00);
      InvalidInputException::InvalidInputException(pIVar10,&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_48 = local_68;
    sStack_40 = sStack_60;
    pMVar13 = accessor->outer;
    pCVar3 = accessor->inner->data;
    uVar6 = v_t[this->CRN];
    uVar9 = (pCVar3->scan).current_row_index;
    if ((pCVar3->scan).next_row_index <= uVar6 || uVar6 < uVar9) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,uVar6,&pCVar3->scan,pDVar1);
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (timestamp_t *)pvVar7->data;
      pvVar7 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar7);
      pCVar3->validity = &pvVar7->validity;
      uVar9 = (pCVar3->scan).current_row_index;
    }
    local_88._M_dataplus._M_p = (pointer)pCVar3->data[(uint)((int)uVar6 - (int)uVar9)].value;
    RVar15 = MadAccessor<duckdb::timestamp_t,_duckdb::interval_t,_duckdb::timestamp_t>::operator()
                       (pMVar13,(INPUT_TYPE *)&local_88);
    input_01._0_8_ = RVar15.micros;
    iVar11 = 0;
    bVar5 = TryCast::Operation<duckdb::interval_t,duckdb::interval_t>
                      (RVar15,(interval_t *)&local_68,false);
    if (!bVar5) {
      pIVar10 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.micros = iVar11;
      CastExceptionText<duckdb::interval_t,duckdb::interval_t>(&local_88,RVar15._0_8_,input_01);
      InvalidInputException::InvalidInputException(pIVar10,&local_88);
      __cxa_throw(pIVar10,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_88._M_dataplus._M_p = local_68;
    local_88._M_string_length = sStack_60;
    iVar16 = CastInterpolation::Interpolate<duckdb::interval_t>
                       ((interval_t *)&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (interval_t *)&local_88);
  }
  return iVar16;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}